

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::UdpInputPortDeclSyntax::UdpInputPortDeclSyntax
          (UdpInputPortDeclSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *names)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  IdentifierNameSyntax *pIVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  size_t index;
  
  uVar6 = keyword._0_8_;
  (this->super_UdpPortDeclSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_UdpPortDeclSyntax).super_SyntaxNode.kind = UdpInputPortDecl;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc =
       uVar4;
  (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_UdpPortDeclSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_UdpPortDeclSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_UdpPortDeclSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_UdpPortDeclSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  SVar3 = (names->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(names->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->names).super_SyntaxListBase.super_SyntaxNode.parent =
       (names->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->names).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->names).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->names).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->names).super_SyntaxListBase.childCount = (names->super_SyntaxListBase).childCount;
  (this->names).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed330;
  sVar1 = (names->elements).size_;
  (this->names).elements.data_ = (names->elements).data_;
  (this->names).elements.size_ = sVar1;
  (this->names).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar8 = (this->names).elements.size_ + 1;
  if (1 < uVar8) {
    index = 0;
    do {
      pIVar5 = SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::operator[]
                         (&this->names,index);
      (pIVar5->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)this
      ;
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  return;
}

Assistant:

UdpInputPortDeclSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<IdentifierNameSyntax>& names) :
        UdpPortDeclSyntax(SyntaxKind::UdpInputPortDecl, attributes), keyword(keyword), names(names) {
        this->names.parent = this;
        for (auto child : this->names)
            child->parent = this;
    }